

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::RemoveFieldInfo::Deserialize(RemoveFieldInfo *this,Deserializer *deserializer)

{
  undefined1 uVar1;
  uint uVar2;
  RemoveFieldInfo *this_00;
  pointer pRVar4;
  pointer *__ptr;
  unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true> result;
  _Head_base<0UL,_duckdb::RemoveFieldInfo_*,_false> local_28;
  int iVar3;
  
  this_00 = (RemoveFieldInfo *)operator_new(0x98);
  RemoveFieldInfo(this_00);
  local_28._M_head_impl = this_00;
  pRVar4 = unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,400,"column_path",&pRVar4->column_path);
  pRVar4 = unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>
                       *)&local_28);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x191,"if_column_exists");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  pRVar4->if_column_exists = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pRVar4 = unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>
                       *)&local_28);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x192,"cascade");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  pRVar4->cascade = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> RemoveFieldInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RemoveFieldInfo>(new RemoveFieldInfo());
	deserializer.ReadPropertyWithDefault<vector<string>>(400, "column_path", result->column_path);
	deserializer.ReadPropertyWithDefault<bool>(401, "if_column_exists", result->if_column_exists);
	deserializer.ReadPropertyWithDefault<bool>(402, "cascade", result->cascade);
	return std::move(result);
}